

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* tlx::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *into,char *sep,size_t sep_size,string *str,size_type limit)

{
  bool bVar1;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char *local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  const_iterator last;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  const_iterator it_1;
  size_type limit_local;
  string *str_local;
  size_t sep_size_local;
  char *sep_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *into_local;
  
  it_1._M_current = (char *)limit;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(into);
  if (it_1._M_current != (char *)0x0) {
    if (sep_size == 0) {
      local_40._M_current = (char *)std::__cxx11::string::begin();
      while( true ) {
        local_48._M_current = (char *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
        if (!bVar1) break;
        it._M_current =
             (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_40,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                   &local_40,&it);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_40);
      }
    }
    else {
      local_60._M_current = (char *)std::__cxx11::string::begin();
      last._M_current = local_60._M_current;
      while( true ) {
        local_68 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&last,sep_size);
        local_70._M_current = (char *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator<(&local_68,&local_70);
        if (!bVar1) break;
        local_78 = last._M_current;
        bVar1 = std::
                equal<char_const*,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (sep,sep + sep_size,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )last._M_current);
        if (bVar1) {
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(into);
          if (it_1._M_current <= (char *)(sVar2 + 1)) {
            local_80._M_current = (char *)std::__cxx11::string::end();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                       &local_60,&local_80);
            return into;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                     &local_60,&last);
          local_88 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator+(&last,sep_size);
          local_60 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_88;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&last);
      }
      local_90._M_current = (char *)std::__cxx11::string::end();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,&local_60
                 ,&local_90);
    }
  }
  return into;
}

Assistant:

static inline
std::vector<std::string>& split(
    std::vector<std::string>* into,
    const char* sep, size_t sep_size, const std::string& str,
    std::string::size_type limit) {

    into->clear();
    if (limit == 0) return *into;

    if (sep_size == 0)
    {
        std::string::const_iterator it = str.begin();
        while (it != str.end()) {
            into->emplace_back(it, it + 1);
            ++it;
        }
        return *into;
    }

    std::string::const_iterator it = str.begin(), last = it;

    for ( ; it + sep_size < str.end(); ++it)
    {
        if (std::equal(sep, sep + sep_size, it))
        {
            if (into->size() + 1 >= limit)
            {
                into->emplace_back(last, str.end());
                return *into;
            }

            into->emplace_back(last, it);
            last = it + sep_size;
        }
    }

    into->emplace_back(last, str.end());

    return *into;
}